

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void patchJump(int offset)

{
  int iVar1;
  Chunk *pCVar2;
  int in_EDI;
  int jump;
  
  pCVar2 = currentChunk();
  iVar1 = (pCVar2->count - in_EDI) + -2;
  if (0xffff < iVar1) {
    error((char *)0x107030);
  }
  pCVar2 = currentChunk();
  pCVar2->code[in_EDI] = (uint8_t)((uint)iVar1 >> 8);
  pCVar2 = currentChunk();
  pCVar2->code[in_EDI + 1] = (uint8_t)iVar1;
  return;
}

Assistant:

static void patchJump(int offset) {
    // -2 to adjust for the bytecode for the jump offset itself.
    int jump = currentChunk()->count - offset - 2;

    // Set limitation for JUMP instruction
    if (jump > UINT16_MAX) {
        error("Too much code to jump over.");
    }

    currentChunk()->code[offset] = (jump >> 8) & 0xff;
    currentChunk()->code[offset + 1] = jump & 0xff;
}